

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * mi_heap_zalloc(mi_heap_t *heap,size_t size)

{
  void *pvVar1;
  mi_heap_t *in_RSI;
  size_t in_stack_ffffffffffffffe8;
  
  pvVar1 = _mi_heap_malloc_zero(in_RSI,in_stack_ffffffffffffffe8,false);
  return pvVar1;
}

Assistant:

void* mi_heap_zalloc(mi_heap_t* heap, size_t size) mi_attr_noexcept {
  return _mi_heap_malloc_zero(heap, size, true);
}